

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O1

Atom_t __thiscall Potassco::ProgramReader::matchAtom(ProgramReader *this,char *err)

{
  bool bVar1;
  uint uVar2;
  BufferedStream *this_00;
  int64_t x;
  Atom_t local_20;
  undefined4 uStack_1c;
  
  this_00 = stream(this);
  uVar2 = this->varMax_;
  bVar1 = BufferedStream::match(this_00,(int64_t *)&local_20,false);
  if (((!bVar1) || (CONCAT44(uStack_1c,local_20) < 1)) ||
     ((long)(ulong)uVar2 < CONCAT44(uStack_1c,local_20))) {
    uVar2 = BufferedStream::line(this_00);
    BufferedStream::fail(uVar2,err);
  }
  return local_20;
}

Assistant:

Atom_t   matchAtom(const char* err = "atom expected") { return Potassco::matchAtom(*stream(), varMax_, err); }